

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::dump(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,ostream *os,bool recursive)

{
  byte bVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  long lVar4;
  basic_node_ptr<unodb::detail::olc_node_header> local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,recursive);
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::dump((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          *)this,os,recursive);
  bVar1 = this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>(os,", key bytes & child indexes\n",0x1c);
  lVar4 = 0;
  uVar3 = 0;
  do {
    if ((this->child_indexes)._M_elems[lVar4].value.super___atomic_base<unsigned_char>._M_i != 0xff)
    {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      dump_byte(os,(byte)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(os,", child index = ",0x10);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      if (*(long *)((long)&this->children +
                   (ulong)(this->child_indexes)._M_elems[lVar4].value.
                          super___atomic_base<unsigned_char>._M_i * 8) == 0) {
        __assert_fail("children.pointer_array[child_indexes[i]] != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9bc,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
      if ((char)local_34 != '\0') {
        local_40.tagged_ptr =
             *(uintptr_t *)
              ((long)&this->children +
              (ulong)(this->child_indexes)._M_elems[lVar4].value.super___atomic_base<unsigned_char>.
                     _M_i * 8);
        basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
        ::dump_node(os,&local_40,true);
      }
      uVar3 = uVar3 + 1;
      if (bVar1 < uVar3) {
        __assert_fail("actual_children_count <= children_count_",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9c3,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x100) {
      if (uVar3 == bVar1) {
        return;
      }
      __assert_fail("actual_children_count == children_count_",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x9c7,
                    "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
  } while( true );
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool recursive) const {
    parent_class::dump(os, recursive);
#ifndef NDEBUG
    const auto children_count_ = this->children_count.load();
    unsigned actual_children_count = 0;
#endif

    os << ", key bytes & child indexes\n";
    for (unsigned i = 0; i < 256; i++)
      if (child_indexes[i] != empty_child) {
        os << " ";
        dump_byte(os, static_cast<std::byte>(i));
        os << ", child index = " << static_cast<unsigned>(child_indexes[i])
           << ": ";
        UNODB_DETAIL_ASSERT(children.pointer_array[child_indexes[i]] !=
                            nullptr);
        if (recursive) {
          ArtPolicy::dump_node(os,
                               children.pointer_array[child_indexes[i]].load());
        }
#ifndef NDEBUG
        ++actual_children_count;
        UNODB_DETAIL_ASSERT(actual_children_count <= children_count_);
#endif
      }

    UNODB_DETAIL_ASSERT(actual_children_count == children_count_);
  }